

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

string * __thiscall pbrt::Image::ToString_abi_cxx11_(string *__return_storage_ptr__,Image *this)

{
  long lVar1;
  string local_50;
  
  lVar1 = (this->encoding).
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits << 0x10;
  if (lVar1 == 0) {
    local_50._M_dataplus._M_p = "(nullptr)";
  }
  else {
    ColorEncodingHandle::ToString_abi_cxx11_(&local_50,&this->encoding);
  }
  StringPrintf<pbrt::PixelFormat_const&,pbrt::Point2<int>const&,pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>const&,char_const*>
            (__return_storage_ptr__,
             (pbrt *)"[ Image format: %s resolution: %s channelNames: %s encoding: %s ]",
             (char *)this,(PixelFormat *)&this->resolution,(Point2<int> *)&this->channelNames,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffa8,(char **)local_50._M_dataplus._M_p);
  if (lVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Image::ToString() const {
    return StringPrintf("[ Image format: %s resolution: %s channelNames: %s "
                        "encoding: %s ]",
                        format, resolution, channelNames,
                        encoding ? encoding.ToString().c_str() : "(nullptr)");
}